

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void testing::internal::ReportInvalidTestCaseType(char *test_case_name,char *file,int line)

{
  undefined8 uVar1;
  undefined8 uVar2;
  Message errors;
  char (*in_stack_ffffffffffffff18) [68];
  Message *in_stack_ffffffffffffff20;
  FILE *__stream;
  Message *in_stack_ffffffffffffff50;
  string local_70 [32];
  string local_50 [36];
  int in_stack_ffffffffffffffd4;
  char *in_stack_ffffffffffffffd8;
  
  Message::Message(in_stack_ffffffffffffff50);
  Message::operator<<(in_stack_ffffffffffffff20,(char (*) [37])in_stack_ffffffffffffff18);
  Message::operator<<(in_stack_ffffffffffffff20,(char **)in_stack_ffffffffffffff18);
  Message::operator<<(in_stack_ffffffffffffff20,(char (*) [3])in_stack_ffffffffffffff18);
  Message::operator<<(in_stack_ffffffffffffff20,(char (*) [64])in_stack_ffffffffffffff18);
  Message::operator<<(in_stack_ffffffffffffff20,(char (*) [31])in_stack_ffffffffffffff18);
  Message::operator<<(in_stack_ffffffffffffff20,(char **)in_stack_ffffffffffffff18);
  Message::operator<<(in_stack_ffffffffffffff20,(char (*) [13])in_stack_ffffffffffffff18);
  Message::operator<<(in_stack_ffffffffffffff20,(char (*) [63])in_stack_ffffffffffffff18);
  Message::operator<<(in_stack_ffffffffffffff20,(char (*) [62])in_stack_ffffffffffffff18);
  Message::operator<<(in_stack_ffffffffffffff20,(char (*) [62])in_stack_ffffffffffffff18);
  Message::operator<<(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  Message::operator<<(in_stack_ffffffffffffff20,(char (*) [12])in_stack_ffffffffffffff18);
  __stream = _stderr;
  FormatFileLocation_abi_cxx11_(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
  uVar1 = std::__cxx11::string::c_str();
  Message::GetString_abi_cxx11_((Message *)__stream);
  uVar2 = std::__cxx11::string::c_str();
  fprintf(__stream,"%s %s",uVar1,uVar2);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  Message::~Message((Message *)0x484ed9);
  return;
}

Assistant:

void ReportInvalidTestCaseType(const char* test_case_name,
                               const char* file, int line) {
  Message errors;
  errors
      << "Attempted redefinition of test case " << test_case_name << ".\n"
      << "All tests in the same test case must use the same test fixture\n"
      << "class.  However, in test case " << test_case_name << ", you tried\n"
      << "to define a test using a fixture class different from the one\n"
      << "used earlier. This can happen if the two fixture classes are\n"
      << "from different namespaces and have the same name. You should\n"
      << "probably rename one of the classes to put the tests into different\n"
      << "test cases.";

  fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
          errors.GetString().c_str());
}